

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_postprocess.cpp
# Opt level: O3

void __thiscall FGLRenderer::PostProcessFXAA(FGLRenderer *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  FFXAAShader *pFVar3;
  FGLPostProcessState savedState;
  undefined8 local_40;
  FGLPostProcessState local_38;
  
  if (gl_postprocess.Value != 0) {
    uVar1 = this->mBuffers->mWidth;
    uVar2 = this->mBuffers->mHeight;
    local_40 = CONCAT44((float)(int)uVar2,(float)(int)uVar1);
    FGLPostProcessState::FGLPostProcessState(&local_38);
    FGLRenderBuffers::BindNextFB(this->mBuffers);
    FGLRenderBuffers::BindCurrentTexture(this->mBuffers,0);
    FFXAAShader::Bind(this->mFXAAShader);
    pFVar3 = this->mFXAAShader;
    if ((pFVar3->InputTexture).mBuffer != 0) {
      (pFVar3->InputTexture).mBuffer = 0;
      (*_ptrc_glUniform1i)((pFVar3->InputTexture).mIndex,0);
      pFVar3 = this->mFXAAShader;
    }
    FBufferedUniform2f::Set(&pFVar3->Resolution,(float *)&local_40);
    (*(this->mVBO->super_FVertexBuffer)._vptr_FVertexBuffer[2])();
    gl_RenderState.mCurrentVertexBuffer = (FVertexBuffer *)0x0;
    (*_ptrc_glDrawArrays)(5,8,4);
    FGLRenderBuffers::NextTexture(this->mBuffers);
    FGLPostProcessState::~FGLPostProcessState(&local_38);
  }
  return;
}

Assistant:

void FGLRenderer::PostProcessFXAA()
{
	if (0 == gl_postprocess)
	{
		return;
	}

	const GLfloat resolution[2] =
	{
		static_cast<GLfloat>(mBuffers->GetWidth()),
		static_cast<GLfloat>(mBuffers->GetHeight())
	};

	FGLPostProcessState savedState;

	mBuffers->BindNextFB();
	mBuffers->BindCurrentTexture(0);
	mFXAAShader->Bind();
	mFXAAShader->InputTexture.Set(0);
	mFXAAShader->Resolution.Set(resolution);
	RenderScreenQuad();
	mBuffers->NextTexture();
}